

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  EGLBoolean EVar3;
  EGLint EVar4;
  uint uVar5;
  EGLInternalData2 *this;
  EGLSurface pvVar6;
  EGLContext pvVar7;
  GLubyte *pGVar8;
  GLubyte *sl;
  GLubyte *ver;
  GLubyte *ren;
  GLubyte *ven;
  EGLint local_1e0;
  EGLBoolean initialized;
  int minor;
  int major;
  EGLDisplay display;
  EGLint egl_error;
  EGLint num_devices;
  EGLDeviceEXT egl_devices [32];
  int max_devices;
  int egl_version;
  EGLInternalData2 *m_data;
  EGLint egl_pbuffer_attribs [5];
  EGLint aEStack_88 [2];
  EGLint egl_config_attribs [13];
  EGLDisplay egl_display;
  EGLContext egl_context;
  EGLSurface egl_surface;
  EGLConfig egl_config;
  EGLint num_configs;
  EGLBoolean success;
  int m_renderDevice;
  int m_windowHeight;
  int m_windowWidth;
  char **argv_local;
  int argc_local;
  
  egl_config_attribs[6] = 0x3033;
  egl_config_attribs[7] = 1;
  egl_config_attribs[8] = 0x3040;
  egl_config_attribs[9] = 8;
  egl_config_attribs[2] = 0x3022;
  egl_config_attribs[3] = 8;
  egl_config_attribs[4] = 0x3025;
  egl_config_attribs[5] = 8;
  aEStack_88[0] = 0x3024;
  aEStack_88[1] = 8;
  egl_config_attribs[0] = 0x3023;
  egl_config_attribs[1] = 8;
  egl_config_attribs[10] = 0x3038;
  m_data._0_4_ = 0x3057;
  m_data._4_4_ = 0x100;
  egl_pbuffer_attribs[0] = 0x3056;
  egl_pbuffer_attribs[1] = 0x100;
  egl_pbuffer_attribs[2] = 0x3038;
  this = (EGLInternalData2 *)operator_new(0x38);
  EGLInternalData2::EGLInternalData2(this);
  iVar2 = gladLoaderLoadEGL((EGLDisplay)0x0);
  if (iVar2 == 0) {
    fprintf(_stderr,"failed to EGL with glad.\n");
    exit(1);
  }
  egl_devices[0x1f]._4_4_ = 0x20;
  display._4_4_ = 0;
  display._0_4_ = (*glad_eglGetError)();
  EVar3 = (*glad_eglQueryDevicesEXT)(0x20,(EGLDeviceEXT *)&egl_error,(EGLint *)((long)&display + 4))
  ;
  if ((EVar3 == 0) || ((EGLint)display != 0x3000)) {
    printf("eglQueryDevicesEXT Failed.\n");
    this->egl_display = (EGLDisplay)0x0;
  }
  iVar2 = atoi(argv[1]);
  this->m_renderDevice = iVar2;
  _minor = (*glad_eglGetPlatformDisplayEXT)
                     (0x313f,*(void **)(&egl_error + (long)this->m_renderDevice * 2),(EGLint *)0x0);
  EVar4 = (*glad_eglGetError)();
  if ((EVar4 == 0x3000) && (_minor != (EGLDisplay)0x0)) {
    EVar3 = (*glad_eglInitialize)(_minor,(EGLint *)&initialized,&local_1e0);
    EVar4 = (*glad_eglGetError)();
    if ((EVar4 == 0x3000) && (EVar3 == 1)) {
      this->egl_display = _minor;
    }
  }
  EVar3 = (*glad_eglInitialize)(this->egl_display,(EGLint *)0x0,(EGLint *)0x0);
  if (EVar3 == 0) {
    fprintf(_stderr,"Unable to initialize EGL\n");
    exit(1);
  }
  iVar2 = gladLoaderLoadEGL(this->egl_display);
  if (iVar2 == 0) {
    fprintf(_stderr,"Unable to reload EGL.\n");
    exit(1);
  }
  printf("Loaded EGL %d.%d after reload.\n",(long)iVar2 / 10000 & 0xffffffff,
         (long)iVar2 % 10000 & 0xffffffff);
  EVar3 = (*glad_eglBindAPI)(0x30a2);
  this->success = EVar3;
  if (this->success == 0) {
    fprintf(_stderr,"Failed to bind OpenGL API.\n");
    exit(1);
  }
  EVar3 = (*glad_eglChooseConfig)
                    (this->egl_display,aEStack_88,&this->egl_config,1,&this->num_configs);
  this->success = EVar3;
  pFVar1 = _stderr;
  if (this->success == 0) {
    uVar5 = (*glad_eglGetError)();
    fprintf(pFVar1,"Failed to choose config (eglError: %d)\n",(ulong)uVar5);
    exit(1);
  }
  if (this->num_configs != 1) {
    fprintf(_stderr,"Didn\'t get exactly one config, but %d\n",(ulong)(uint)this->num_configs);
    exit(1);
  }
  pvVar6 = (*glad_eglCreatePbufferSurface)(this->egl_display,this->egl_config,(EGLint *)&m_data);
  this->egl_surface = pvVar6;
  pFVar1 = _stderr;
  if (this->egl_surface == (EGLSurface)0x0) {
    uVar5 = (*glad_eglGetError)();
    fprintf(pFVar1,"Unable to create EGL surface (eglError: %d)\n",(ulong)uVar5);
    exit(1);
  }
  pvVar7 = (*glad_eglCreateContext)
                     (this->egl_display,this->egl_config,(EGLContext)0x0,(EGLint *)0x0);
  this->egl_context = pvVar7;
  pFVar1 = _stderr;
  if (this->egl_context != (EGLContext)0x0) {
    EVar3 = (*glad_eglMakeCurrent)
                      (this->egl_display,this->egl_surface,this->egl_surface,this->egl_context);
    this->success = EVar3;
    pFVar1 = _stderr;
    if (this->success == 0) {
      uVar5 = (*glad_eglGetError)();
      fprintf(pFVar1,"Failed to make context current (eglError: %d)\n",(ulong)uVar5);
      exit(1);
    }
    iVar2 = gladLoadGL((GLADloadfunc)glad_eglGetProcAddress);
    if (iVar2 != 0) {
      pGVar8 = (*glad_glGetString)(0x1f00);
      printf("GL_VENDOR=%s\n",pGVar8);
      pGVar8 = (*glad_glGetString)(0x1f01);
      printf("GL_RENDERER=%s\n",pGVar8);
      pGVar8 = (*glad_glGetString)(0x1f02);
      printf("GL_VERSION=%s\n",pGVar8);
      pGVar8 = (*glad_glGetString)(0x8b8c);
      printf("GL_SHADING_LANGUAGE_VERSION=%s\n",pGVar8);
      return 0;
    }
    fprintf(_stderr,"failed to load GL with glad.\n");
    exit(1);
  }
  uVar5 = (*glad_eglGetError)();
  fprintf(pFVar1,"Unable to create EGL context (eglError: %d)\n",(ulong)uVar5);
  exit(1);
}

Assistant:

int main(int argc, char ** argv){


    int m_windowWidth;
    int m_windowHeight;
    int m_renderDevice;
    
    EGLBoolean success;
    EGLint num_configs;
    EGLConfig egl_config;
    EGLSurface egl_surface;
    EGLContext egl_context;
    EGLDisplay egl_display;
    
    m_windowWidth = 256;
    m_windowHeight = 256;
    m_renderDevice = -1;

    EGLint egl_config_attribs[] = {EGL_RED_SIZE,
        8,
        EGL_GREEN_SIZE,
        8,
        EGL_BLUE_SIZE,
        8,
        EGL_DEPTH_SIZE,
        8,
        EGL_SURFACE_TYPE,
        EGL_PBUFFER_BIT,
        EGL_RENDERABLE_TYPE,
        EGL_OPENGL_BIT,
        EGL_NONE};
    
    EGLint egl_pbuffer_attribs[] = {
        EGL_WIDTH, m_windowWidth, EGL_HEIGHT, m_windowHeight,
        EGL_NONE,
    };
    
    EGLInternalData2* m_data = new EGLInternalData2();

    // Load EGL functions
    int egl_version = gladLoaderLoadEGL(NULL);
    if(!egl_version) {
        fprintf(stderr, "failed to EGL with glad.\n");
        exit(EXIT_FAILURE);

    };

    // Query EGL Devices
    const int max_devices = 32;
    EGLDeviceEXT egl_devices[max_devices];
    EGLint num_devices = 0;
    EGLint egl_error = eglGetError();
    if (!eglQueryDevicesEXT(max_devices, egl_devices, &num_devices) ||
        egl_error != EGL_SUCCESS) {
        printf("eglQueryDevicesEXT Failed.\n");
        m_data->egl_display = EGL_NO_DISPLAY;
    }

    //printf("number of devices found %d\n", num_devices);

    
    m_data->m_renderDevice = atoi(argv[1]);

        // Set display
        EGLDisplay display = eglGetPlatformDisplayEXT(EGL_PLATFORM_DEVICE_EXT,
                                                      egl_devices[m_data->m_renderDevice], NULL);
        if (eglGetError() == EGL_SUCCESS && display != EGL_NO_DISPLAY) {
            int major, minor;
            EGLBoolean initialized = eglInitialize(display, &major, &minor);
            if (eglGetError() == EGL_SUCCESS && initialized == EGL_TRUE) {
                m_data->egl_display = display;
            }
        }

    if (!eglInitialize(m_data->egl_display, NULL, NULL)) {
        fprintf(stderr, "Unable to initialize EGL\n");
        exit(EXIT_FAILURE);
    }

    egl_version = gladLoaderLoadEGL(m_data->egl_display);
    if (!egl_version) {
        fprintf(stderr, "Unable to reload EGL.\n");
        exit(EXIT_FAILURE);
    }
    printf("Loaded EGL %d.%d after reload.\n", GLAD_VERSION_MAJOR(egl_version),
           GLAD_VERSION_MINOR(egl_version));


    m_data->success = eglBindAPI(EGL_OPENGL_API);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to bind OpenGL API.\n");
        exit(EXIT_FAILURE);
    }

    m_data->success =
    eglChooseConfig(m_data->egl_display, egl_config_attribs,
                    &m_data->egl_config, 1, &m_data->num_configs);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to choose config (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }
    if (m_data->num_configs != 1) {
        fprintf(stderr, "Didn't get exactly one config, but %d\n", m_data->num_configs);
        exit(EXIT_FAILURE);
    }

    m_data->egl_surface = eglCreatePbufferSurface(
                                                  m_data->egl_display, m_data->egl_config, egl_pbuffer_attribs);
    if (m_data->egl_surface == EGL_NO_SURFACE) {
        fprintf(stderr, "Unable to create EGL surface (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }


    m_data->egl_context = eglCreateContext(
                                           m_data->egl_display, m_data->egl_config, EGL_NO_CONTEXT, NULL);
    if (!m_data->egl_context) {
        fprintf(stderr, "Unable to create EGL context (eglError: %d)\n",eglGetError());
        exit(EXIT_FAILURE);
    }

    m_data->success =
        eglMakeCurrent(m_data->egl_display, m_data->egl_surface, m_data->egl_surface,
                   m_data->egl_context);
    if (!m_data->success) {
        fprintf(stderr, "Failed to make context current (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }

    if (!gladLoadGL(eglGetProcAddress)) {
        fprintf(stderr, "failed to load GL with glad.\n");
        exit(EXIT_FAILURE);
    }

    const GLubyte* ven = glGetString(GL_VENDOR);
    printf("GL_VENDOR=%s\n", ven);

    const GLubyte* ren = glGetString(GL_RENDERER);
    printf("GL_RENDERER=%s\n", ren);
    const GLubyte* ver = glGetString(GL_VERSION);
    printf("GL_VERSION=%s\n", ver);
    const GLubyte* sl = glGetString(GL_SHADING_LANGUAGE_VERSION);
    printf("GL_SHADING_LANGUAGE_VERSION=%s\n", sl);

    return 0;
}